

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_setfenv(lua_State *L,int idx)

{
  TValue *pTVar1;
  GCobj *v;
  GCtab *t;
  cTValue *o;
  int idx_local;
  lua_State *L_local;
  TValue *o_1;
  
  pTVar1 = index2adr(L,idx);
  v = (GCobj *)(L->top[-1].u64 & 0x7fffffffffff);
  if ((int)(pTVar1->field_4).it >> 0xf == -9) {
    *(GCobj **)((pTVar1->u64 & 0x7fffffffffff) + 0x10) = v;
  }
  else if ((int)(pTVar1->field_4).it >> 0xf == -0xd) {
    *(GCobj **)((pTVar1->u64 & 0x7fffffffffff) + 0x10) = v;
  }
  else {
    if ((int)(pTVar1->field_4).it >> 0xf != -7) {
      L->top = L->top + -1;
      return 0;
    }
    *(GCobj **)((pTVar1->u64 & 0x7fffffffffff) + 0x48) = v;
  }
  if ((((v->gch).marked & 3) != 0) && ((*(byte *)((pTVar1->u64 & 0x7fffffffffff) + 8) & 4) != 0)) {
    lj_gc_barrierf((global_State *)(L->glref).ptr64,(GCobj *)(pTVar1->u64 & 0x7fffffffffff),v);
  }
  L->top = L->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setfenv(lua_State *L, int idx)
{
  cTValue *o = index2adr_check(L, idx);
  GCtab *t;
  lj_checkapi_slot(1);
  lj_checkapi(tvistab(L->top-1), "top stack slot is not a table");
  t = tabV(L->top-1);
  if (tvisfunc(o)) {
    setgcref(funcV(o)->c.env, obj2gco(t));
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->env, obj2gco(t));
  } else if (tvisthread(o)) {
    setgcref(threadV(o)->env, obj2gco(t));
  } else {
    L->top--;
    return 0;
  }
  lj_gc_objbarrier(L, gcV(o), t);
  L->top--;
  return 1;
}